

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O1

ion_err_t sldict_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                     ion_dict_cursor_t **cursor)

{
  byte bVar1;
  int iVar2;
  ion_skiplist_t *skiplist;
  char cVar3;
  ion_dict_cursor_t *piVar4;
  ion_predicate_t *__ptr;
  void *pvVar5;
  void *pvVar6;
  ion_sl_node_t *piVar7;
  sl_node *psVar8;
  size_t __size;
  ion_err_t iVar9;
  
  piVar4 = (ion_dict_cursor_t *)malloc(0x30);
  *cursor = piVar4;
  iVar9 = '\x06';
  if (piVar4 == (ion_dict_cursor_t *)0x0) {
    return '\x06';
  }
  skiplist = (ion_skiplist_t *)dictionary->instance;
  piVar4->dictionary = dictionary;
  piVar4->status = '\x03';
  piVar4->destroy = sldict_destroy_cursor;
  piVar4->next = sldict_next;
  __ptr = (ion_predicate_t *)malloc(0x20);
  piVar4->predicate = __ptr;
  if (__ptr == (ion_predicate_t *)0x0) {
LAB_00107f46:
    free(piVar4);
  }
  else {
    bVar1 = predicate->type;
    __ptr->type = bVar1;
    __ptr->destroy = predicate->destroy;
    if (3 < bVar1) {
      return '\x05';
    }
    iVar2 = (skiplist->super).record.key_size;
    __size = (size_t)iVar2;
    switch(bVar1) {
    case 0:
      pvVar5 = (predicate->statement).range.lower_bound;
      pvVar6 = malloc(__size);
      (__ptr->statement).range.lower_bound = pvVar6;
      if (pvVar6 == (void *)0x0) goto LAB_00107f3e;
      memcpy(pvVar6,pvVar5,__size);
      piVar7 = sl_find_node(skiplist,pvVar5);
      if ((piVar7->key == (ion_key_t)0x0) ||
         (cVar3 = (*dictionary->instance->compare)(piVar7->key,pvVar5,iVar2), cVar3 != '\0')) {
LAB_00107f50:
        (*cursor)->status = '\x01';
      }
      else {
        piVar4 = *cursor;
        piVar4->status = '\x02';
        *(ion_sl_node_t **)(piVar4 + 1) = piVar7;
      }
      break;
    case 1:
      pvVar5 = malloc(__size);
      (__ptr->statement).range.lower_bound = pvVar5;
      if (pvVar5 != (void *)0x0) {
        memcpy(pvVar5,(predicate->statement).range.lower_bound,__size);
        pvVar6 = malloc(__size);
        (__ptr->statement).range.upper_bound = pvVar6;
        if (pvVar6 != (void *)0x0) {
          memcpy(pvVar6,(predicate->statement).range.upper_bound,__size);
          piVar7 = sl_find_node(skiplist,pvVar6);
          if ((piVar7->key == (ion_key_t)0x0) ||
             (cVar3 = (*dictionary->instance->compare)
                                (piVar7->key,((*cursor)->predicate->statement).range.lower_bound,
                                 iVar2), cVar3 < '\0')) goto LAB_00107f50;
          psVar8 = sl_find_node((ion_skiplist_t *)dictionary->instance,
                                ((*cursor)->predicate->statement).range.lower_bound);
          if (psVar8->key != (ion_key_t)0x0) goto LAB_00107f70;
          do {
            psVar8 = *psVar8->next;
LAB_00107f70:
            if (psVar8 == (ion_sl_node_t *)0x0) goto LAB_00107f50;
            cVar3 = (*dictionary->instance->compare)
                              (psVar8->key,((*cursor)->predicate->statement).range.lower_bound,iVar2
                              );
          } while (cVar3 < '\0');
          piVar4 = *cursor;
          piVar4->status = '\x02';
          *(sl_node **)(piVar4 + 1) = psVar8;
          break;
        }
        free(pvVar5);
      }
LAB_00107f3e:
      free(__ptr);
      goto LAB_00107f46;
    case 2:
      psVar8 = *skiplist->head->next;
      if (psVar8 == (sl_node *)0x0) {
        piVar4->status = '\x01';
      }
      else {
        *(sl_node **)(piVar4 + 1) = psVar8;
        piVar4->status = '\x02';
      }
    }
    iVar9 = '\0';
  }
  return iVar9;
}

Assistant:

ion_err_t
sldict_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	*cursor = malloc(sizeof(ion_sldict_cursor_t));

	ion_skiplist_t *skip_list = (ion_skiplist_t *) dictionary->instance;

	if (NULL == *cursor) {
		return err_out_of_memory;
	}

	(*cursor)->dictionary	= dictionary;
	(*cursor)->status		= cs_cursor_uninitialized;

	(*cursor)->destroy		= sldict_destroy_cursor;
	(*cursor)->next			= sldict_next;

	(*cursor)->predicate	= malloc(sizeof(ion_predicate_t));

	if (NULL == (*cursor)->predicate) {
		free(*cursor);
		return err_out_of_memory;
	}

	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	ion_key_size_t key_size = dictionary->instance->record.key_size;

	switch (predicate->type) {
		case predicate_equality: {
			ion_key_t target_key = predicate->statement.equality.equality_value;

			(*cursor)->predicate->statement.equality.equality_value = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.equality.equality_value) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.equality.equality_value, target_key, key_size);

			ion_sl_node_t *loc = sl_find_node((ion_skiplist_t *) dictionary->instance, target_key);

			if ((NULL == loc->key) || (dictionary->instance->compare(loc->key, target_key, key_size) != 0)) {
				/* If this happens, that means the target key doesn't exist */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;

				ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) (*cursor);

				sl_cursor->current = loc;
				return err_ok;
			}

			break;
		}

		case predicate_range: {
			(*cursor)->predicate->statement.range.lower_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.lower_bound) {
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, key_size);

			(*cursor)->predicate->statement.range.upper_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.upper_bound) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, key_size);

			/* Try to find the node containing the upper bound. */
			ion_sl_node_t *loc = sl_find_node((ion_skiplist_t *) dictionary->instance, (*cursor)->predicate->statement.range.upper_bound);

			if ((NULL == loc->key) || (dictionary->instance->compare(loc->key, (*cursor)->predicate->statement.range.lower_bound, key_size) < 0)) {
				/* This means the returned node is smaller than the lower bound, which means that there are no valid records to return */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				loc = sl_find_node((ion_skiplist_t *) dictionary->instance, (*cursor)->predicate->statement.range.lower_bound);

				if (NULL == loc->key) {
					/* If this happens, then we hit the head node. Just move to the first valid data item (if exists) */
					loc = loc->next[0];
				}

				/* Increment the location until we hit valid data. It is impossible to fall through here, since we just confirmed previously */
				/* that there does indeed exist valid data (See above check). */
				while (NULL != loc && (dictionary->instance->compare(loc->key, (*cursor)->predicate->statement.range.lower_bound, key_size) < 0)) {
					loc = loc->next[0];
				}

				/* We sanity check this anyways just in case. */
				if (NULL == loc) {
					(*cursor)->status = cs_end_of_results;
					return err_ok;
				}

				(*cursor)->status = cs_cursor_initialized;

				ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) (*cursor);

				sl_cursor->current = loc;
				return err_ok;
			}

			break;
		}

		case predicate_all_records: {
			ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) (*cursor);

			if (NULL == skip_list->head->next[0]) {
				(*cursor)->status = cs_end_of_results;
			}
			else {
				sl_cursor->current	= skip_list->head->next[0];
				(*cursor)->status	= cs_cursor_initialized;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	return err_ok;
}